

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::ValueFlag<int,_args::ValueReader<int>_>::ParseValue
          (ValueFlag<int,_args::ValueReader<int>_> *this,string *value_)

{
  ValueReader<int>::operator()
            ((ValueReader<int> *)&this->field_0xcc,
             &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name,value_,&this->value);
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
            }